

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_READ_MINDS(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster_conflict *pmVar4;
  source sVar5;
  source origin;
  source origin_00;
  wchar_t local_50;
  wchar_t local_4c;
  monster *mon;
  _Bool found;
  wchar_t dist_x;
  wchar_t dist_y;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  if (context->y == 0) {
    local_4c = (context->value).dice;
  }
  else {
    local_4c = context->y;
  }
  if (context->x == 0) {
    local_50 = (context->value).sides;
  }
  else {
    local_50 = context->x;
  }
  bVar1 = false;
  for (dist_x = L'\x01'; wVar3 = cave_monster_max(cave), dist_x < wVar3; dist_x = dist_x + L'\x01')
  {
    pmVar4 = cave_monster(cave,dist_x);
    if ((pmVar4->race != (monster_race *)0x0) &&
       (_Var2 = flag_has_dbg(pmVar4->mflag,2,5,"mon->mflag","MFLAG_MARK"), _Var2)) {
      sVar5 = source_monster(dist_x);
      origin.which = sVar5.which;
      origin._4_4_ = 0;
      origin.what = sVar5.what;
      effect_simple(L'\x1d',origin,"0",L'\0',L'\0',L'\0',local_4c,local_50,(_Bool *)0x0);
      bVar1 = true;
    }
  }
  if (bVar1) {
    msg("Images form in your mind!");
    context->ident = true;
    if (context->other != 0) {
      sVar5 = source_player();
      origin_00.which = sVar5.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar5.what;
      effect_simple(L'\x1f',origin_00,"0",L'\0',L'\0',L'\0',cave->height,cave->width,(_Bool *)0x0);
    }
  }
  return true;
}

Assistant:

bool effect_handler_READ_MINDS(effect_handler_context_t *context)
{
	int i;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	bool found = false;

	/* Scan monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Detect all appropriate monsters */
		if (mflag_has(mon->mflag, MFLAG_MARK)) {
			/* Map around it */
			effect_simple(EF_MAP_AREA, source_monster(i), "0", 0, 0, 0,
						  dist_y, dist_x, NULL);
			found = true;
		}
	}

	if (found) {
		msg("Images form in your mind!");
		context->ident = true;
		if (context->other) {
			effect_simple(EF_DETECT_TRAPS, source_player(), "0", 0, 0, 0,
						  cave->height, cave->width, NULL);
		}
	}

	return true;
}